

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall imrt::ApertureILS::simpleLocalSearch(ApertureILS *this,Plan *P,bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  double dVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double extraout_XMM0_Qa_00;
  double local_28;
  
  local_28 = Plan::getEvaluation(P);
  dVar3 = (double)(int)CONCAT71(in_register_00000011,verbose);
  bVar1 = true;
  while (bVar1) {
    (*(this->super_ILS)._vptr_ILS[3])(dVar3,this,P,1);
    dVar4 = extraout_XMM0_Qa;
    if (local_28 <= extraout_XMM0_Qa) {
      dVar4 = local_28;
    }
    (*(this->super_ILS)._vptr_ILS[4])(dVar3,this,P,1);
    bVar1 = extraout_XMM0_Qa_00 < dVar4;
    local_28 = extraout_XMM0_Qa_00;
    if (dVar4 <= extraout_XMM0_Qa_00) {
      local_28 = dVar4;
    }
  }
  std::operator<<((ostream *)&std::cout,"Local search finished with: ");
  poVar2 = std::ostream::_M_insert<double>(local_28);
  std::operator<<(poVar2," effectively ");
  dVar3 = Plan::getEvaluation(P);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar3 = Plan::getEvaluation(P);
  return dVar3;
}

Assistant:

double ApertureILS::simpleLocalSearch(Plan& P, bool verbose) {
  bool improvement=true;
  double local_best=P.getEvaluation(), aux_best;
  while (improvement) {
    improvement =false;
    aux_best = iLocalSearch(P, verbose);
    if (aux_best<local_best) {
      local_best=aux_best;
    }
    aux_best = aLocalSearch(P, verbose);
    if (aux_best<local_best) {
      local_best=aux_best;
      improvement=true;
    } 
  }
  cout << "Local search finished with: " << local_best << " effectively "<< P.getEvaluation()<< endl;
  return(P.getEvaluation());
}